

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::f_formatter<spdlog::details::null_scoped_padder>::format
          (f_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  long lVar1;
  size_t sVar2;
  uint uVar3;
  uint32_or_64_or_128_t<unsigned_long> n;
  ulong value;
  int iVar4;
  ulong uVar5;
  char local_40 [21];
  char local_2b [3];
  char *local_28;
  
  lVar1 = (msg->time).__d.__r;
  value = (lVar1 / 1000000000) * -1000000 + lVar1 / 1000;
  lVar1 = 0x3f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> lVar1 == 0; lVar1 = lVar1 + -1) {
    }
  }
  uVar3 = (uint)(byte)fmt::v11::detail::do_count_digits(unsigned_long)::bsr2log10[lVar1] -
          (uint)(value < *(ulong *)(fmt::v11::detail::do_count_digits(unsigned_long)::
                                    zero_or_powers_of_10 +
                                   (ulong)(byte)fmt::v11::detail::do_count_digits(unsigned_long)::
                                                bsr2log10[lVar1] * 8));
  if (uVar3 < 6) {
    iVar4 = 6 - uVar3;
    do {
      uVar5 = (dest->super_buffer<char>).size_ + 1;
      if ((dest->super_buffer<char>).capacity_ < uVar5) {
        (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar5);
      }
      sVar2 = (dest->super_buffer<char>).size_;
      (dest->super_buffer<char>).size_ = sVar2 + 1;
      (dest->super_buffer<char>).ptr_[sVar2] = '0';
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  local_28 = fmt::v11::detail::do_format_decimal<char,unsigned_long>(local_40,value,0x15);
  fmt::v11::detail::buffer<char>::append<char>(&dest->super_buffer<char>,local_28,local_2b);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override {
        auto micros = fmt_helper::time_fraction<std::chrono::microseconds>(msg.time);

        const size_t field_size = 6;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::pad6(static_cast<size_t>(micros.count()), dest);
    }